

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest3::getTessellationControlShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest3 *this)

{
  allocator<char> local_19;
  NegativeTest3 *local_18;
  NegativeTest3 *this_local;
  
  local_18 = this;
  this_local = (NegativeTest3 *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout(vertices=4) out;\n\nsubroutine void testSubroutineType(inout vec4 test);\n\nvoid testSubroutine1(inout vec4 test)\n{\n    test += vec4(1, 2, 3, 4);\n}\n\nuniform testSubroutineType subroutineFunction;\n\nvoid main()\n{\n    vec4 test = vec4(0, 1, 2, 3);\n\n    subroutineFunction(test);\n\n    gl_out[gl_InvocationID].gl_Position = test;\n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest3::getTessellationControlShaderBody() const
{
	return "#version 400\n"
		   "\n"
		   "#extension GL_ARB_shader_subroutine : require\n"
		   "\n"
		   "layout(vertices=4) out;\n"
		   "\n"
		   "subroutine void testSubroutineType(inout vec4 test);\n"
		   "\n"
		   "void testSubroutine1(inout vec4 test)\n"
		   "{\n"
		   "    test += vec4(1, 2, 3, 4);\n"
		   "}\n"
		   "\n"
		   "uniform testSubroutineType subroutineFunction;\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    vec4 test = vec4(0, 1, 2, 3);\n"
		   "\n"
		   "    subroutineFunction(test);\n"
		   "\n"
		   "    gl_out[gl_InvocationID].gl_Position = test;\n"
		   "}\n";
}